

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_sse2.c
# Opt level: O1

int GetResidualCost_SSE2(int ctx0,VP8Residual *res)

{
  byte bVar1;
  uint uVar2;
  short *psVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  int iVar43;
  uint uVar44;
  uint16_t *puVar45;
  long lVar46;
  long lVar47;
  CostArrayPtr papuVar48;
  uint8_t auVar49 [16];
  undefined1 auVar50 [16];
  byte local_78 [4];
  byte bStack_74;
  byte bStack_73;
  byte bStack_72;
  byte bStack_71;
  byte bStack_70;
  byte bStack_6f;
  byte bStack_6e;
  byte bStack_6d;
  byte bStack_6c;
  byte bStack_6b;
  byte bStack_6a;
  byte bStack_69;
  byte local_68 [4];
  byte bStack_64;
  byte bStack_63;
  byte bStack_62;
  byte bStack_61;
  byte bStack_60;
  byte bStack_5f;
  byte bStack_5e;
  byte bStack_5d;
  byte bStack_5c;
  byte bStack_5b;
  byte bStack_5a;
  byte bStack_59;
  undefined1 local_58 [16];
  uint8_t ctxs [16];
  uint8_t levels [16];
  uint16_t abs_levels [16];
  
  iVar43 = res->first;
  lVar46 = (long)iVar43;
  bVar1 = res->prob[lVar46][ctx0][0];
  uVar44 = 0;
  if (ctx0 == 0) {
    uVar44 = (uint)VP8EntropyCost[(byte)~bVar1];
  }
  uVar2 = res->last;
  if ((int)uVar2 < 0) {
    uVar44 = (uint)VP8EntropyCost[bVar1];
  }
  else {
    puVar45 = res->costs[lVar46][ctx0];
    psVar3 = res->coeffs;
    sVar27 = *psVar3;
    sVar28 = psVar3[1];
    sVar29 = psVar3[2];
    sVar30 = psVar3[3];
    sVar31 = psVar3[4];
    sVar32 = psVar3[5];
    sVar33 = psVar3[6];
    sVar34 = psVar3[7];
    sVar35 = psVar3[8];
    sVar36 = psVar3[9];
    sVar37 = psVar3[10];
    sVar38 = psVar3[0xb];
    sVar39 = psVar3[0xc];
    sVar40 = psVar3[0xd];
    sVar41 = psVar3[0xe];
    sVar42 = psVar3[0xf];
    sVar19 = -sVar27;
    sVar20 = -sVar28;
    sVar21 = -sVar29;
    sVar22 = -sVar30;
    sVar23 = -sVar31;
    sVar24 = -sVar32;
    sVar25 = -sVar33;
    sVar26 = -sVar34;
    local_58._0_2_ = (ushort)(sVar19 < sVar27) * sVar27 | (ushort)(sVar19 >= sVar27) * sVar19;
    local_58._2_2_ = (ushort)(sVar20 < sVar28) * sVar28 | (ushort)(sVar20 >= sVar28) * sVar20;
    local_58._4_2_ = (ushort)(sVar21 < sVar29) * sVar29 | (ushort)(sVar21 >= sVar29) * sVar21;
    local_58._6_2_ = (ushort)(sVar22 < sVar30) * sVar30 | (ushort)(sVar22 >= sVar30) * sVar22;
    local_58._8_2_ = (ushort)(sVar23 < sVar31) * sVar31 | (ushort)(sVar23 >= sVar31) * sVar23;
    local_58._10_2_ = (ushort)(sVar24 < sVar32) * sVar32 | (ushort)(sVar24 >= sVar32) * sVar24;
    local_58._12_2_ = (ushort)(sVar25 < sVar33) * sVar33 | (ushort)(sVar25 >= sVar33) * sVar25;
    local_58._14_2_ = (ushort)(sVar26 < sVar34) * sVar34 | (ushort)(sVar26 >= sVar34) * sVar26;
    sVar19 = -sVar35;
    sVar20 = -sVar36;
    sVar21 = -sVar37;
    sVar22 = -sVar38;
    sVar23 = -sVar39;
    sVar24 = -sVar40;
    sVar25 = -sVar41;
    sVar26 = -sVar42;
    auVar49._0_2_ = (ushort)(sVar19 < sVar35) * sVar35 | (ushort)(sVar19 >= sVar35) * sVar19;
    auVar49._2_2_ = (ushort)(sVar20 < sVar36) * sVar36 | (ushort)(sVar20 >= sVar36) * sVar20;
    auVar49._4_2_ = (ushort)(sVar21 < sVar37) * sVar37 | (ushort)(sVar21 >= sVar37) * sVar21;
    auVar49._6_2_ = (ushort)(sVar22 < sVar38) * sVar38 | (ushort)(sVar22 >= sVar38) * sVar22;
    auVar49._8_2_ = (ushort)(sVar23 < sVar39) * sVar39 | (ushort)(sVar23 >= sVar39) * sVar23;
    auVar49._10_2_ = (ushort)(sVar24 < sVar40) * sVar40 | (ushort)(sVar24 >= sVar40) * sVar24;
    auVar49._12_2_ = (ushort)(sVar25 < sVar41) * sVar41 | (ushort)(sVar25 >= sVar41) * sVar25;
    auVar49._14_2_ = (ushort)(sVar26 < sVar42) * sVar42 | (ushort)(sVar26 >= sVar42) * sVar26;
    auVar50 = packsswb(local_58,(undefined1  [16])auVar49);
    bVar1 = auVar50[0];
    bVar4 = auVar50[1];
    bVar5 = auVar50[2];
    bVar6 = auVar50[3];
    bVar7 = auVar50[4];
    bVar8 = auVar50[5];
    bVar9 = auVar50[6];
    bVar10 = auVar50[7];
    bVar11 = auVar50[8];
    bVar12 = auVar50[9];
    bVar13 = auVar50[10];
    bVar14 = auVar50[0xb];
    bVar15 = auVar50[0xc];
    bVar16 = auVar50[0xd];
    bVar17 = auVar50[0xe];
    bVar18 = auVar50[0xf];
    local_78[0] = (bVar1 < 2) * bVar1 | (bVar1 >= 2) * '\x02';
    local_78[1] = (bVar4 < 2) * bVar4 | (bVar4 >= 2) * '\x02';
    local_78[2] = (bVar5 < 2) * bVar5 | (bVar5 >= 2) * '\x02';
    local_78[3] = (bVar6 < 2) * bVar6 | (bVar6 >= 2) * '\x02';
    bStack_74 = (bVar7 < 2) * bVar7 | (bVar7 >= 2) * '\x02';
    bStack_73 = (bVar8 < 2) * bVar8 | (bVar8 >= 2) * '\x02';
    bStack_72 = (bVar9 < 2) * bVar9 | (bVar9 >= 2) * '\x02';
    bStack_71 = (bVar10 < 2) * bVar10 | (bVar10 >= 2) * '\x02';
    bStack_70 = (bVar11 < 2) * bVar11 | (bVar11 >= 2) * '\x02';
    bStack_6f = (bVar12 < 2) * bVar12 | (bVar12 >= 2) * '\x02';
    bStack_6e = (bVar13 < 2) * bVar13 | (bVar13 >= 2) * '\x02';
    bStack_6d = (bVar14 < 2) * bVar14 | (bVar14 >= 2) * '\x02';
    bStack_6c = (bVar15 < 2) * bVar15 | (bVar15 >= 2) * '\x02';
    bStack_6b = (bVar16 < 2) * bVar16 | (bVar16 >= 2) * '\x02';
    bStack_6a = (bVar17 < 2) * bVar17 | (bVar17 >= 2) * '\x02';
    bStack_69 = (bVar18 < 2) * bVar18 | (bVar18 >= 2) * '\x02';
    local_68[0] = (0x43 < bVar1) * 'C' | (0x43 >= bVar1) * bVar1;
    local_68[1] = (0x43 < bVar4) * 'C' | (0x43 >= bVar4) * bVar4;
    local_68[2] = (0x43 < bVar5) * 'C' | (0x43 >= bVar5) * bVar5;
    local_68[3] = (0x43 < bVar6) * 'C' | (0x43 >= bVar6) * bVar6;
    bStack_64 = (0x43 < bVar7) * 'C' | (0x43 >= bVar7) * bVar7;
    bStack_63 = (0x43 < bVar8) * 'C' | (0x43 >= bVar8) * bVar8;
    bStack_62 = (0x43 < bVar9) * 'C' | (0x43 >= bVar9) * bVar9;
    bStack_61 = (0x43 < bVar10) * 'C' | (0x43 >= bVar10) * bVar10;
    bStack_60 = (0x43 < bVar11) * 'C' | (0x43 >= bVar11) * bVar11;
    bStack_5f = (0x43 < bVar12) * 'C' | (0x43 >= bVar12) * bVar12;
    bStack_5e = (0x43 < bVar13) * 'C' | (0x43 >= bVar13) * bVar13;
    bStack_5d = (0x43 < bVar14) * 'C' | (0x43 >= bVar14) * bVar14;
    bStack_5c = (0x43 < bVar15) * 'C' | (0x43 >= bVar15) * bVar15;
    bStack_5b = (0x43 < bVar16) * 'C' | (0x43 >= bVar16) * bVar16;
    bStack_5a = (0x43 < bVar17) * 'C' | (0x43 >= bVar17) * bVar17;
    bStack_59 = (0x43 < bVar18) * 'C' | (0x43 >= bVar18) * bVar18;
    ctxs[0] = (uint8_t)auVar49._0_2_;
    ctxs[1] = (uint8_t)(auVar49._0_2_ >> 8);
    ctxs[2] = (uint8_t)auVar49._2_2_;
    ctxs[3] = (uint8_t)(auVar49._2_2_ >> 8);
    ctxs[4] = (uint8_t)auVar49._4_2_;
    ctxs[5] = (uint8_t)(auVar49._4_2_ >> 8);
    ctxs[6] = (uint8_t)auVar49._6_2_;
    ctxs[7] = (uint8_t)(auVar49._6_2_ >> 8);
    ctxs[8] = (uint8_t)auVar49._8_2_;
    ctxs[9] = (uint8_t)(auVar49._8_2_ >> 8);
    ctxs[10] = (uint8_t)auVar49._10_2_;
    ctxs[0xb] = (uint8_t)(auVar49._10_2_ >> 8);
    ctxs[0xc] = (uint8_t)auVar49._12_2_;
    ctxs[0xd] = (uint8_t)(auVar49._12_2_ >> 8);
    ctxs[0xe] = (uint8_t)auVar49._14_2_;
    ctxs[0xf] = (uint8_t)(auVar49._14_2_ >> 8);
    if (iVar43 < (int)uVar2) {
      papuVar48 = res->costs + lVar46;
      lVar47 = 0;
      do {
        papuVar48 = papuVar48 + 1;
        uVar44 = (uint)puVar45[local_68[lVar47 + lVar46]] +
                 VP8LevelFixedCosts[*(ushort *)(local_58 + lVar47 * 2 + lVar46 * 2)] + uVar44;
        puVar45 = (*papuVar48)[local_78[lVar47 + lVar46]];
        lVar47 = lVar47 + 1;
      } while ((ulong)uVar2 - lVar46 != lVar47);
      iVar43 = iVar43 + (int)lVar47;
    }
    lVar46 = (long)iVar43;
    uVar44 = (uint)puVar45[local_68[lVar46]] +
             VP8LevelFixedCosts[*(ushort *)(local_58 + lVar46 * 2)] + uVar44;
    if (iVar43 < 0xf) {
      uVar44 = uVar44 + VP8EntropyCost
                        [*(byte *)((long)*res->prob +
                                  (ulong)local_78[lVar46] * 0xb +
                                  (ulong)""[lVar46 + 1] * 0x20 + (ulong)""[lVar46 + 1])];
    }
  }
  return uVar44;
}

Assistant:

static int GetResidualCost_SSE2(int ctx0, const VP8Residual* const res) {
  uint8_t levels[16], ctxs[16];
  uint16_t abs_levels[16];
  int n = res->first;
  // should be prob[VP8EncBands[n]], but it's equivalent for n=0 or 1
  const int p0 = res->prob[n][ctx0][0];
  CostArrayPtr const costs = res->costs;
  const uint16_t* t = costs[n][ctx0];
  // bit_cost(1, p0) is already incorporated in t[] tables, but only if ctx != 0
  // (as required by the syntax). For ctx0 == 0, we need to add it here or it'll
  // be missing during the loop.
  int cost = (ctx0 == 0) ? VP8BitCost(1, p0) : 0;

  if (res->last < 0) {
    return VP8BitCost(0, p0);
  }

  {   // precompute clamped levels and contexts, packed to 8b.
    const __m128i zero = _mm_setzero_si128();
    const __m128i kCst2 = _mm_set1_epi8(2);
    const __m128i kCst67 = _mm_set1_epi8(MAX_VARIABLE_LEVEL);
    const __m128i c0 = _mm_loadu_si128((const __m128i*)&res->coeffs[0]);
    const __m128i c1 = _mm_loadu_si128((const __m128i*)&res->coeffs[8]);
    const __m128i D0 = _mm_sub_epi16(zero, c0);
    const __m128i D1 = _mm_sub_epi16(zero, c1);
    const __m128i E0 = _mm_max_epi16(c0, D0);   // abs(v), 16b
    const __m128i E1 = _mm_max_epi16(c1, D1);
    const __m128i F = _mm_packs_epi16(E0, E1);
    const __m128i G = _mm_min_epu8(F, kCst2);    // context = 0,1,2
    const __m128i H = _mm_min_epu8(F, kCst67);   // clamp_level in [0..67]

    _mm_storeu_si128((__m128i*)&ctxs[0], G);
    _mm_storeu_si128((__m128i*)&levels[0], H);

    _mm_storeu_si128((__m128i*)&abs_levels[0], E0);
    _mm_storeu_si128((__m128i*)&abs_levels[8], E1);
  }
  for (; n < res->last; ++n) {
    const int ctx = ctxs[n];
    const int level = levels[n];
    const int flevel = abs_levels[n];   // full level
    cost += VP8LevelFixedCosts[flevel] + t[level];  // simplified VP8LevelCost()
    t = costs[n + 1][ctx];
  }
  // Last coefficient is always non-zero
  {
    const int level = levels[n];
    const int flevel = abs_levels[n];
    assert(flevel != 0);
    cost += VP8LevelFixedCosts[flevel] + t[level];
    if (n < 15) {
      const int b = VP8EncBands[n + 1];
      const int ctx = ctxs[n];
      const int last_p0 = res->prob[b][ctx][0];
      cost += VP8BitCost(0, last_p0);
    }
  }
  return cost;
}